

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O3

SRC_ERROR sinc_hex_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  float fVar1;
  undefined8 uVar2;
  int iVar3;
  SINC_FILTER *filter;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  SRC_ERROR SVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  int half_filter_chan_len;
  int iVar17;
  int channels;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  double local_98 [6];
  double local_68 [7];
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    SVar11 = SRC_ERR_NO_PRIVATE;
  }
  else {
    channels = state->channels;
    lVar19 = (long)channels;
    filter->in_count = data->input_frames * lVar19;
    lVar22 = data->output_frames * lVar19;
    filter->out_count = lVar22;
    filter->out_gen = 0;
    filter->in_used = 0;
    dVar28 = state->last_ratio;
    SVar11 = SRC_ERR_BAD_INTERNAL_STATE;
    if ((0.00390625 <= dVar28) && (dVar28 <= 256.0)) {
      dVar29 = dVar28;
      if (data->src_ratio <= dVar28) {
        dVar29 = data->src_ratio;
      }
      dVar27 = state->last_position;
      dVar32 = dVar27 - (double)(int)ROUND(dVar27);
      dVar32 = (double)(~-(ulong)(dVar32 < 0.0) & (ulong)dVar32 |
                       (ulong)(dVar32 + 1.0) & -(ulong)(dVar32 < 0.0));
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar32;
      iVar20 = filter->b_len;
      lVar16 = (long)((int)ROUND(dVar27 - dVar32) * channels + filter->b_current) % (long)iVar20;
      filter->b_current = (int)lVar16;
      if (lVar22 < 1) {
        lVar16 = 0;
        lVar22 = 0;
      }
      else {
        dVar32 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
        dVar27 = 1.0 / dVar28;
        half_filter_chan_len =
             ((int)ROUND((double)(-(ulong)(dVar29 < 1.0) & (ulong)(dVar32 / dVar29) |
                                 ~-(ulong)(dVar29 < 1.0) & (ulong)dVar32)) + 1) * channels;
        iVar21 = filter->b_end;
        do {
          iVar15 = (int)lVar16;
          dVar32 = auVar33._0_8_;
          if (((iVar21 - iVar15) + iVar20) % iVar20 <= half_filter_chan_len) {
            SVar11 = prepare_data(filter,channels,data,half_filter_chan_len);
            state->error = SVar11;
            if (SVar11 != SRC_ERR_NO_ERROR) {
              return SVar11;
            }
            iVar15 = filter->b_current;
            iVar21 = filter->b_end;
            iVar20 = filter->b_len;
            if (((iVar21 - iVar15) + iVar20) % iVar20 <= half_filter_chan_len) break;
          }
          if ((-1 < filter->b_real_end) &&
             ((double)filter->b_real_end <= (double)iVar15 + dVar32 + dVar27 + 1e-20)) break;
          lVar19 = filter->out_count;
          if (lVar19 < 1) {
            lVar22 = filter->out_gen;
          }
          else {
            dVar29 = state->last_ratio;
            lVar22 = filter->out_gen;
            if (1e-10 < ABS(dVar29 - data->src_ratio)) {
              dVar28 = ((data->src_ratio - dVar29) * (double)lVar22) / (double)lVar19 + dVar29;
            }
          }
          iVar13 = filter->index_inc;
          dVar29 = dVar28;
          if (1.0 <= dVar28) {
            dVar29 = 1.0;
          }
          dVar29 = dVar29 * (double)iVar13;
          uVar25 = (uint)ROUND(dVar29 * 4096.0);
          iVar17 = (int)ROUND(dVar32 * dVar29 * 4096.0);
          pfVar4 = data->data_out;
          channels = state->channels;
          iVar3 = filter->coeff_half_len;
          iVar12 = (iVar3 * 0x1000 - iVar17) / (int)uVar25;
          uVar26 = iVar12 * uVar25 + iVar17;
          uVar23 = iVar15 - iVar12 * channels;
          if ((int)uVar23 < 0) {
            if (((int)uVar25 < 1) || ((int)uVar26 < 0)) {
              __assert_fail("divident >= 0 && divisor > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0xa0,"int int_div_ceil(int, int)");
            }
            uVar24 = (5 - uVar23) / 6;
            if (((uVar25 + uVar26) - 1) / uVar25 < uVar24) {
              __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x354,
                            "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            uVar26 = uVar26 - uVar24 * uVar25;
            uVar23 = uVar23 + ((5 - uVar23) / 6) * 6;
          }
          local_68[4] = 0.0;
          local_68[5] = 0.0;
          local_68[2] = 0.0;
          local_68[3] = 0.0;
          local_68[0] = 0.0;
          local_68[1] = 0.0;
          if (-1 < (int)uVar26) {
            uVar14 = (ulong)uVar23;
            lVar16 = uVar14 * 4;
            do {
              uVar24 = uVar26 >> 0xc;
              if (iVar3 < (int)uVar24) {
                __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x35c,
                              "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              if (((int)uVar23 < 0) || (iVar12 = (int)uVar14 + 5, iVar20 <= iVar12)) {
                __assert_fail("data_index >= 0 && data_index + 5 < filter->b_len",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x35e,
                              "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              if (iVar21 <= iVar12) {
                __assert_fail("data_index + 5 < filter->b_end",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x35f,
                              "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              fVar1 = filter->coeffs[uVar24];
              dVar31 = (double)(uVar26 & 0xfff) * 0.000244140625 *
                       (double)(filter->coeffs[(ulong)uVar24 + 1] - fVar1) + (double)fVar1;
              pfVar5 = filter->buffer;
              lVar18 = 0;
              do {
                uVar2 = *(undefined8 *)((long)pfVar5 + lVar18 * 4 + lVar16);
                dVar10 = (double)(float)((ulong)uVar2 >> 0x20) * dVar31 + local_68[lVar18 + 1];
                auVar9._8_4_ = SUB84(dVar10,0);
                auVar9._0_8_ = (double)(float)uVar2 * dVar31 + local_68[lVar18];
                auVar9._12_4_ = (int)((ulong)dVar10 >> 0x20);
                *(undefined1 (*) [16])(local_68 + lVar18) = auVar9;
                lVar18 = lVar18 + 2;
              } while (lVar18 != 6);
              uVar14 = uVar14 + 6;
              lVar16 = lVar16 + 0x18;
              uVar26 = uVar26 - uVar25;
            } while (-1 < (int)uVar26);
          }
          dVar29 = dVar29 / (double)iVar13;
          iVar13 = (int)(iVar3 * 0x1000 - (uVar25 - iVar17)) / (int)uVar25;
          uVar26 = (iVar13 + 1) * channels + iVar15;
          local_98[4] = 0.0;
          local_98[5] = 0.0;
          local_98[2] = 0.0;
          local_98[3] = 0.0;
          local_98[0] = 0.0;
          local_98[1] = 0.0;
          uVar23 = iVar13 * uVar25 + (uVar25 - iVar17);
          do {
            uVar24 = (int)uVar23 >> 0xc;
            if (((int)uVar24 < 0) || (iVar3 < (int)uVar24)) {
              __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x371,
                            "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            if (((int)uVar26 < 0) || (iVar20 <= (int)(uVar26 + 5))) {
              __assert_fail("data_index >= 0 && data_index + 5 < filter->b_len",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x373,
                            "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            if (iVar21 <= (int)(uVar26 + 5)) {
              __assert_fail("data_index + 5 < filter->b_end",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x374,
                            "void calc_output_hex(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            fVar1 = filter->coeffs[uVar24];
            dVar31 = (double)(uVar23 & 0xfff) * 0.000244140625 *
                     (double)(filter->coeffs[(ulong)uVar24 + 1] - fVar1) + (double)fVar1;
            pfVar5 = filter->buffer;
            lVar16 = 0;
            do {
              dVar10 = (double)(float)((ulong)*(undefined8 *)(pfVar5 + (ulong)uVar26 + lVar16) >>
                                      0x20) * dVar31 + local_98[lVar16 + 1];
              auVar7._8_4_ = SUB84(dVar10,0);
              auVar7._0_8_ = (double)(float)*(undefined8 *)(pfVar5 + (ulong)uVar26 + lVar16) *
                             dVar31 + local_98[lVar16];
              auVar7._12_4_ = (int)((ulong)dVar10 >> 0x20);
              *(undefined1 (*) [16])(local_98 + lVar16) = auVar7;
              lVar16 = lVar16 + 2;
            } while (lVar16 != 6);
            uVar26 = uVar26 - 6;
            uVar24 = uVar23 - uVar25;
            bVar6 = (int)uVar25 <= (int)uVar23;
            uVar23 = uVar24;
          } while (uVar24 != 0 && bVar6);
          lVar16 = 0;
          do {
            *(ulong *)(pfVar4 + lVar22 + lVar16) =
                 CONCAT44((float)((local_68[lVar16 + 1] + local_98[lVar16 + 1]) * dVar29),
                          (float)((local_68[lVar16] + local_98[lVar16]) * dVar29));
            lVar16 = lVar16 + 2;
          } while (lVar16 != 6);
          dVar31 = dVar32 + 1.0 / dVar28;
          filter->out_gen = lVar22 + 6;
          dVar29 = dVar31 - (double)(int)ROUND(dVar31);
          auVar30._0_8_ = ~-(ulong)(dVar29 < 0.0) & (ulong)dVar29;
          auVar30._8_8_ = 0;
          auVar8._8_4_ = auVar33._8_4_;
          auVar8._0_8_ = (ulong)(dVar29 + 1.0) & -(ulong)(dVar29 < 0.0);
          auVar8._12_4_ = auVar33._12_4_;
          auVar33 = auVar30 | auVar8;
          dVar32 = auVar33._0_8_;
          lVar16 = (long)((int)ROUND(dVar31 - dVar32) * channels + iVar15) % (long)iVar20;
          filter->b_current = (int)lVar16;
        } while (lVar22 + 6 < lVar19);
        lVar22 = filter->in_used;
        lVar16 = filter->out_gen;
        lVar19 = (long)state->channels;
      }
      state->last_position = dVar32;
      state->last_ratio = dVar28;
      data->input_frames_used = lVar22 / lVar19;
      data->output_frames_gen = lVar16 / lVar19;
      SVar11 = SRC_ERR_NO_ERROR;
    }
  }
  return SVar11;
}

Assistant:

SRC_ERROR
sinc_hex_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_hex (filter, state->channels, increment, start_filter_index, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += 6 ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}